

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O3

void __thiscall
cmComputeLinkInformation::AddTargetItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  cmGeneratorTarget *pcVar4;
  bool bVar5;
  TargetType TVar6;
  iterator iVar7;
  cmGeneratorTarget *local_58;
  Item local_50;
  
  local_58 = target;
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar6 = cmGeneratorTarget::GetType(target);
  if (TVar6 == SHARED_LIBRARY) {
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&this->SharedLibrariesLinked,&local_58);
  }
  if ((this->NoSONameUsesPath == true) &&
     (bVar5 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_58,&this->Config), bVar5)) {
    AddSharedLibNoSOName(this,item);
    return;
  }
  sVar2 = (this->LibLinkFileFlag)._M_string_length;
  if (sVar2 != 0) {
    paVar1 = &local_50.Value.field_2;
    pcVar3 = (this->LibLinkFileFlag)._M_dataplus._M_p;
    local_50.Value._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar3,pcVar3 + sVar2);
    local_50.IsPath = false;
    local_50.Target = (cmGeneratorTarget *)0x0;
    std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
    emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.Value._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.Value._M_dataplus._M_p,
                      local_50.Value.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->OldLinkDirMode == true) &&
     (bVar5 = cmGeneratorTarget::IsFrameworkOnApple(local_58), !bVar5)) {
    cmsys::SystemTools::GetFilenamePath(&local_50.Value,item);
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,&local_50.Value);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.Value._M_dataplus._M_p != &local_50.Value.field_2) {
      operator_delete(local_50.Value._M_dataplus._M_p,
                      local_50.Value.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)iVar7._M_node ==
        &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->OldLinkDirItems,item);
    }
  }
  pcVar4 = local_58;
  paVar1 = &local_50.Value.field_2;
  pcVar3 = (item->_M_dataplus)._M_p;
  local_50.Value._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + item->_M_string_length);
  local_50.IsPath = true;
  local_50.Target = pcVar4;
  std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
  emplace_back<cmComputeLinkInformation::Item>(&this->Items,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.Value._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.Value._M_dataplus._M_p,local_50.Value.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(std::string const& item,
                                             cmGeneratorTarget const* target)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(item);
    return;
  }

  // If this platform wants a flag before the full path, add it.
  if (!this->LibLinkFileFlag.empty()) {
    this->Items.push_back(Item(this->LibLinkFileFlag, false));
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      this->OldLinkDirMask.find(cmSystemTools::GetFilenamePath(item)) ==
        this->OldLinkDirMask.end()) {
    this->OldLinkDirItems.push_back(item);
  }

  // Now add the full path to the library.
  this->Items.push_back(Item(item, true, target));
}